

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoding_backend_init__wav
                    (void *pUserData,ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                    void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_data_source **ppBackend)

{
  ma_data_source_vtable *pAllocationCallbacks_00;
  ma_read_proc in_RCX;
  ma_wav *in_RDI;
  ma_seek_proc in_R8;
  ma_tell_proc in_R9;
  ma_wav *pWav;
  ma_result result;
  size_t in_stack_ffffffffffffffa8;
  ma_allocation_callbacks *in_stack_ffffffffffffffb0;
  ma_data_source_vtable *pmVar1;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  ma_result local_4;
  
  pAllocationCallbacks_00 =
       (ma_data_source_vtable *)
       ma_malloc(in_stack_ffffffffffffffa8,(ma_allocation_callbacks *)0x26931b);
  if (pAllocationCallbacks_00 == (ma_data_source_vtable *)0x0) {
    local_4 = MA_OUT_OF_MEMORY;
  }
  else {
    pmVar1 = pAllocationCallbacks_00;
    local_4 = ma_wav_init(in_RCX,in_R8,in_R9,
                          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (ma_decoding_backend_config *)pAllocationCallbacks_00,
                          in_stack_ffffffffffffffb0,in_RDI);
    if (local_4 == MA_SUCCESS) {
      (pWav->ds).vtable = pmVar1;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffb0,(ma_allocation_callbacks *)pAllocationCallbacks_00);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_decoding_backend_init__wav(void* pUserData, ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_data_source** ppBackend)
{
    ma_result result;
    ma_wav* pWav;

    (void)pUserData;    /* For now not using pUserData, but once we start storing the vorbis decoder state within the ma_decoder structure this will be set to the decoder so we can avoid a malloc. */

    /* For now we're just allocating the decoder backend on the heap. */
    pWav = (ma_wav*)ma_malloc(sizeof(*pWav), pAllocationCallbacks);
    if (pWav == NULL) {
        return MA_OUT_OF_MEMORY;
    }

    result = ma_wav_init(onRead, onSeek, onTell, pReadSeekTellUserData, pConfig, pAllocationCallbacks, pWav);
    if (result != MA_SUCCESS) {
        ma_free(pWav, pAllocationCallbacks);
        return result;
    }

    *ppBackend = pWav;

    return MA_SUCCESS;
}